

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_compatibility.hpp
# Opt level: O0

unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>
 __thiscall
SimpleWeb::
make_steady_timer<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>,long>
          (SimpleWeb *this,
          stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *socket,
          duration<long,_std::ratio<1L,_1L>_> duration)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *this_00;
  duration local_58;
  executor_type local_50;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *local_20;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *socket_local;
  duration<long,_std::ratio<1L,_1L>_> duration_local;
  
  local_20 = socket;
  socket_local = (stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *)
                 duration.__r;
  duration_local.__r = (rep)this;
  this_00 = (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
             *)operator_new(0x70);
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::get_executor
            (&local_50,local_20);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_58,
             (duration<long,_std::ratio<1L,_1L>_> *)&socket_local);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::basic_waitable_timer(this_00,&local_50,&local_58);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>
  ::
  unique_ptr<std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,void>
            ((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>>
              *)this,this_00);
  asio::any_io_executor::~any_io_executor(&local_50);
  return (__uniq_ptr_data<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_true,_true>
          )(__uniq_ptr_data<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<asio::steady_timer> make_steady_timer(socket_type &socket, std::chrono::duration<duration_type> duration) {
    return std::unique_ptr<asio::steady_timer>(new asio::steady_timer(socket.get_executor(), duration));
  }